

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O1

int MD5_Final(uchar *md,MD5_CTX *c)

{
  uint *data;
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(c->A & 0x3f);
  data = c->data;
  lVar4 = uVar5 + 1;
  *(undefined1 *)((long)c->data + uVar5) = 0x80;
  uVar5 = uVar5 ^ 0x3f;
  if (uVar5 < 8) {
    memset((void *)(lVar4 + (long)data),0,uVar5);
    uVar5 = 0x40;
    body((MD5_CTX *)c,data,0x40);
    lVar4 = 0;
  }
  memset((void *)(lVar4 + (long)data),0,uVar5 - 8);
  uVar1 = c->A;
  uVar2 = c->B;
  c->A = uVar1 * 8;
  *(char *)(c->data + 0xe) = (char)(uVar1 * 8);
  *(char *)((long)c->data + 0x39) = (char)(uVar1 >> 5);
  *(char *)((long)c->data + 0x3a) = (char)(uVar1 >> 0xd);
  *(char *)((long)c->data + 0x3b) = (char)(uVar1 >> 0x15);
  c->data[0xf] = uVar2;
  body((MD5_CTX *)c,data,0x40);
  *md = (uchar)c->C;
  md[1] = *(uchar *)((long)&c->C + 1);
  md[2] = *(uchar *)((long)&c->C + 2);
  md[3] = *(uchar *)((long)&c->C + 3);
  md[4] = (uchar)c->D;
  md[5] = *(uchar *)((long)&c->D + 1);
  md[6] = *(uchar *)((long)&c->D + 2);
  md[7] = *(uchar *)((long)&c->D + 3);
  md[8] = (uchar)c->Nl;
  md[9] = *(uchar *)((long)&c->Nl + 1);
  md[10] = *(uchar *)((long)&c->Nl + 2);
  md[0xb] = *(uchar *)((long)&c->Nl + 3);
  md[0xc] = (uchar)c->Nh;
  md[0xd] = *(uchar *)((long)&c->Nh + 1);
  md[0xe] = *(uchar *)((long)&c->Nh + 2);
  md[0xf] = *(uchar *)((long)&c->Nh + 3);
  pvVar3 = memset(c,0,0x98);
  return (int)pvVar3;
}

Assistant:

void MD5_Final(uint8_t *result, MD5_CTX *ctx)
{
  size_t used, available;

  used = ctx->lo & 0x3f;

  ctx->buffer[used++] = 0x80;

  available = 64 - used;

  if (available < 8) {
    memset(&ctx->buffer[used], 0, available);
    body(ctx, ctx->buffer, 64);
    used = 0;
    available = 64;
  }

  memset(&ctx->buffer[used], 0, available - 8);

  ctx->lo <<= 3;
  ctx->buffer[56] = (uint8_t)ctx->lo;
  ctx->buffer[57] = (uint8_t)(ctx->lo >> 8);
  ctx->buffer[58] = (uint8_t)(ctx->lo >> 16);
  ctx->buffer[59] = (uint8_t)(ctx->lo >> 24);
  ctx->buffer[60] = (uint8_t)ctx->hi;
  ctx->buffer[61] = (uint8_t)(ctx->hi >> 8);
  ctx->buffer[62] = (uint8_t)(ctx->hi >> 16);
  ctx->buffer[63] = (uint8_t)(ctx->hi >> 24);

  body(ctx, ctx->buffer, 64);

  result[0] = (uint8_t)ctx->a;
  result[1] = (uint8_t)(ctx->a >> 8);
  result[2] = (uint8_t)(ctx->a >> 16);
  result[3] = (uint8_t)(ctx->a >> 24);
  result[4] = (uint8_t)ctx->b;
  result[5] = (uint8_t)(ctx->b >> 8);
  result[6] = (uint8_t)(ctx->b >> 16);
  result[7] = (uint8_t)(ctx->b >> 24);
  result[8] = (uint8_t)ctx->c;
  result[9] = (uint8_t)(ctx->c >> 8);
  result[10] = (uint8_t)(ctx->c >> 16);
  result[11] = (uint8_t)(ctx->c >> 24);
  result[12] = (uint8_t)ctx->d;
  result[13] = (uint8_t)(ctx->d >> 8);
  result[14] = (uint8_t)(ctx->d >> 16);
  result[15] = (uint8_t)(ctx->d >> 24);

  memset(ctx, 0, sizeof(*ctx));
}